

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransformationData.cpp
# Opt level: O0

void __thiscall
TransformationData::TransformationData
          (TransformationData *this,vector<Quad_*,_std::allocator<Quad_*>_> *quads,Vec2d *coords,
          bool twoState)

{
  vector<Quad_*,_std::allocator<Quad_*>_> *pvVar1;
  Vec2d *pVVar2;
  bool twoState_local;
  Vec2d *coords_local;
  vector<Quad_*,_std::allocator<Quad_*>_> *quads_local;
  TransformationData *this_local;
  
  this->twoState = false;
  pvVar1 = Quad::cloneQuads(quads);
  this->previousQuads = pvVar1;
  this->previousRotation = 0.0;
  pVVar2 = (Vec2d *)operator_new(8);
  Vec2d::Vec2d(pVVar2,coords);
  this->previousOffset = pVVar2;
  pvVar1 = Quad::cloneQuads(quads);
  this->workingQuads = pvVar1;
  this->workingRotation = 0.0;
  pVVar2 = (Vec2d *)operator_new(8);
  Vec2d::Vec2d(pVVar2,coords);
  this->workingOffset = pVVar2;
  this->twoState = twoState;
  return;
}

Assistant:

TransformationData::TransformationData(vector<Quad*>* quads, Vec2d* coords, bool twoState) {
    previousQuads = Quad::cloneQuads(quads);
    previousRotation = 0;
    previousOffset = new Vec2d(coords);
    
    workingQuads = Quad::cloneQuads(quads);
    workingRotation = 0;
    workingOffset = new Vec2d(coords);
    
    this->twoState = twoState;
}